

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void P_CheckFakeFloorTriggers(AActor *mo,double oldz,bool oldz_has_viewheight)

{
  sector_t *psVar1;
  sector_t *psVar2;
  double *pdVar3;
  int iVar4;
  ASectorAction *pAVar5;
  double dVar6;
  double dVar7;
  
  if ((mo->player != (player_t *)0x0) && ((mo->player->cheats & 0x2000) != 0)) {
    return;
  }
  psVar1 = mo->Sector;
  if (psVar1 == (sector_t *)0x0) {
    __assert_fail("sec != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0xb90,"void P_CheckFakeFloorTriggers(AActor *, double, bool)");
  }
  if (psVar1->heightsec == (sector_t *)0x0) {
    return;
  }
  pAVar5 = (psVar1->SecActTarget).field_0.p;
  if (pAVar5 == (ASectorAction *)0x0) {
    return;
  }
  if (((pAVar5->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
    (psVar1->SecActTarget).field_0.p = (ASectorAction *)0x0;
    return;
  }
  psVar2 = psVar1->heightsec;
  dVar6 = ((psVar2->floorplane).normal.Y * (mo->__Pos).Y +
          (psVar2->floorplane).normal.X * (mo->__Pos).X + (psVar2->floorplane).D) *
          (psVar2->floorplane).negiC;
  pdVar3 = &mo->player->viewheight;
  if (mo->player == (player_t *)0x0) {
    pdVar3 = &mo->Height;
  }
  dVar7 = *pdVar3;
  if ((dVar6 < oldz) && ((mo->__Pos).Z <= dVar6)) {
    ASectorAction::TriggerAction((psVar1->SecActTarget).field_0.p,mo,0x400);
  }
  if (!oldz_has_viewheight) {
    oldz = oldz + dVar7;
  }
  dVar7 = dVar7 + (mo->__Pos).Z;
  if ((dVar6 < oldz) || (dVar7 <= dVar6)) {
    if ((oldz <= dVar6) || (dVar6 < dVar7)) goto LAB_00423ece;
    pAVar5 = (psVar1->SecActTarget).field_0.p;
    iVar4 = 0x40;
  }
  else {
    pAVar5 = (psVar1->SecActTarget).field_0.p;
    iVar4 = 0x80;
  }
  ASectorAction::TriggerAction(pAVar5,mo,iVar4);
LAB_00423ece:
  if ((psVar2->MoreFlags & 2) != 0) {
    return;
  }
  dVar6 = ((psVar2->ceilingplane).normal.Y * (mo->__Pos).Y +
          (psVar2->ceilingplane).normal.X * (mo->__Pos).X + (psVar2->ceilingplane).D) *
          (psVar2->ceilingplane).negiC;
  if ((dVar6 < oldz) || (dVar7 <= dVar6)) {
    if (oldz <= dVar6) {
      return;
    }
    if (dVar6 < dVar7) {
      return;
    }
    pAVar5 = (psVar1->SecActTarget).field_0.p;
    iVar4 = 0x100;
  }
  else {
    pAVar5 = (psVar1->SecActTarget).field_0.p;
    iVar4 = 0x200;
  }
  ASectorAction::TriggerAction(pAVar5,mo,iVar4);
  return;
}

Assistant:

void P_CheckFakeFloorTriggers (AActor *mo, double oldz, bool oldz_has_viewheight)
{
	if (mo->player && (mo->player->cheats & CF_PREDICTING))
	{
		return;
	}
	sector_t *sec = mo->Sector;
	assert (sec != NULL);
	if (sec == NULL)
	{
		return;
	}
	if (sec->heightsec != NULL && sec->SecActTarget != NULL)
	{
		sector_t *hs = sec->heightsec;
		double waterz = hs->floorplane.ZatPoint(mo);
		double newz;
		double viewheight;

		if (mo->player != NULL)
		{
			viewheight = mo->player->viewheight;
		}
		else
		{
			viewheight = mo->Height;
		}

		if (oldz > waterz && mo->Z() <= waterz)
		{ // Feet hit fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_HitFakeFloor);
		}

		newz = mo->Z() + viewheight;
		if (!oldz_has_viewheight)
		{
			oldz += viewheight;
		}

		if (oldz <= waterz && newz > waterz)
		{ // View went above fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesSurface);
		}
		else if (oldz > waterz && newz <= waterz)
		{ // View went below fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesDive);
		}

		if (!(hs->MoreFlags & SECF_FAKEFLOORONLY))
		{
			waterz = hs->ceilingplane.ZatPoint(mo);
			if (oldz <= waterz && newz > waterz)
			{ // View went above fake ceiling
				sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesAboveC);
			}
			else if (oldz > waterz && newz <= waterz)
			{ // View went below fake ceiling
				sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesBelowC);
			}
		}
	}
}